

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O0

void __thiscall cmExtraCodeLiteGenerator::Generate(cmExtraCodeLiteGenerator *this)

{
  bool bVar1;
  int iVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *pmVar3;
  char *__s2;
  pointer ppVar4;
  const_reference ppcVar5;
  char *pcVar6;
  cmSystemTools *this_00;
  ostream *poVar7;
  char *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  string local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  undefined1 local_418 [8];
  string filename;
  string projectName;
  undefined1 local_3d0 [8];
  string outputDir;
  _Self local_3a8;
  const_iterator it_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  string local_360;
  string local_340;
  cmMakefile *local_320;
  cmMakefile *mf;
  _Self local_310;
  const_iterator it;
  undefined1 local_2f8 [8];
  cmGeneratedFileStream fout;
  string lprjdebug;
  string workspaceSourcePath;
  string workspaceFileName;
  string workspaceOutputDir;
  string workspaceProjectName;
  cmExtraCodeLiteGenerator *this_local;
  
  std::__cxx11::string::string((string *)(workspaceOutputDir.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(workspaceFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(workspaceSourcePath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(lprjdebug.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&fout.field_0x240);
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_2f8);
  pmVar3 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                     ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  local_310._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
       ::begin(pmVar3);
  while( true ) {
    pmVar3 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                       ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    mf = (cmMakefile *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
         ::end(pmVar3);
    bVar1 = std::operator!=(&local_310,(_Self *)&mf);
    if (!bVar1) break;
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
             ::operator->(&local_310);
    ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&ppVar4->second,0);
    local_320 = cmLocalGenerator::GetMakefile(*ppcVar5);
    GetConfigurationName_abi_cxx11_(&local_340,this,local_320);
    std::__cxx11::string::operator=((string *)&this->ConfigName,(string *)&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
             ::operator->(&local_310);
    ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&ppVar4->second,0);
    pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar5);
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
             ::operator->(&local_310);
    ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&ppVar4->second,0);
    __s2 = cmLocalGenerator::GetBinaryDirectory(*ppcVar5);
    iVar2 = strcmp(pcVar6,__s2);
    if (iVar2 == 0) {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
               ::operator->(&local_310);
      ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&ppVar4->second,0);
      pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar5);
      std::__cxx11::string::operator=((string *)(workspaceFileName.field_2._M_local_buf + 8),pcVar6)
      ;
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
               ::operator->(&local_310);
      ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&ppVar4->second,0);
      cmLocalGenerator::GetProjectName_abi_cxx11_(&local_360,*ppcVar5);
      std::__cxx11::string::operator=
                ((string *)(workspaceOutputDir.field_2._M_local_buf + 8),(string *)&local_360);
      std::__cxx11::string::~string((string *)&local_360);
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
               ::operator->(&local_310);
      ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&ppVar4->second,0);
      pcVar6 = cmLocalGenerator::GetSourceDirectory(*ppcVar5);
      std::__cxx11::string::operator=((string *)(lprjdebug.field_2._M_local_buf + 8),pcVar6);
      std::operator+(&local_380,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&workspaceFileName.field_2 + 8),"/");
      std::__cxx11::string::operator=
                ((string *)(workspaceSourcePath.field_2._M_local_buf + 8),(string *)&local_380);
      std::__cxx11::string::~string((string *)&local_380);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&workspaceOutputDir.field_2 + 8),".workspace");
      std::__cxx11::string::operator+=
                ((string *)(workspaceSourcePath.field_2._M_local_buf + 8),(string *)&it_1);
      std::__cxx11::string::~string((string *)&it_1);
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
               ::operator->(&local_310);
      ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&ppVar4->second,0);
      pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar5);
      std::__cxx11::string::operator=((string *)&this->WorkspacePath,pcVar6);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      in_RCX = (char *)0x0;
      cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_2f8,pcVar6,false,false);
      poVar7 = std::operator<<((ostream *)local_2f8,
                               "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n<CodeLite_Workspace Name=\""
                              );
      poVar7 = std::operator<<(poVar7,(string *)(workspaceOutputDir.field_2._M_local_buf + 8));
      std::operator<<(poVar7,"\" >\n");
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
    ::operator++(&local_310);
  }
  pmVar3 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                     ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  local_3a8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
       ::begin(pmVar3);
  while( true ) {
    pmVar3 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                       ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    outputDir.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
         ::end(pmVar3);
    bVar1 = std::operator!=(&local_3a8,(_Self *)((long)&outputDir.field_2 + 8));
    if (!bVar1) break;
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
             ::operator->(&local_3a8);
    ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&ppVar4->second,0);
    pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_3d0,pcVar6,(allocator *)(projectName.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(projectName.field_2._M_local_buf + 0xf));
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
             ::operator->(&local_3a8);
    ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&ppVar4->second,0);
    cmLocalGenerator::GetProjectName_abi_cxx11_((string *)((long)&filename.field_2 + 8),*ppcVar5);
    std::operator+(&local_458,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0,
                   "/");
    std::operator+(&local_438,&local_458,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&filename.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418,
                   &local_438,".project");
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_458);
    this_00 = (cmSystemTools *)std::__cxx11::string::c_str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::RelativePath_abi_cxx11_(&local_478,this_00,pcVar6,in_RCX);
    std::__cxx11::string::operator=((string *)local_418,(string *)&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
             ::operator->(&local_3a8);
    CreateProjectFile(this,&ppVar4->second);
    poVar7 = std::operator<<((ostream *)local_2f8,"  <Project Name=\"");
    poVar7 = std::operator<<(poVar7,(string *)(filename.field_2._M_local_buf + 8));
    poVar7 = std::operator<<(poVar7,"\" Path=\"");
    poVar7 = std::operator<<(poVar7,(string *)local_418);
    std::operator<<(poVar7,"\" Active=\"No\"/>\n");
    std::operator+(&local_4f8,"<Project Name=\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&filename.field_2 + 8));
    std::operator+(&local_4d8,&local_4f8,"\" ConfigName=\"");
    std::operator+(&local_4b8,&local_4d8,&this->ConfigName);
    std::operator+(&local_498,&local_4b8,"\"/>\n");
    std::__cxx11::string::operator+=((string *)&fout.field_0x240,(string *)&local_498);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::__cxx11::string::~string((string *)local_418);
    std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_3d0);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
    ::operator++(&local_3a8);
  }
  poVar7 = std::operator<<((ostream *)local_2f8,
                           "  <BuildMatrix>\n    <WorkspaceConfiguration Name=\"");
  poVar7 = std::operator<<(poVar7,(string *)&this->ConfigName);
  poVar7 = std::operator<<(poVar7,"\" Selected=\"yes\">\n      ");
  poVar7 = std::operator<<(poVar7,(string *)&fout.field_0x240);
  std::operator<<(poVar7,"    </WorkspaceConfiguration>\n  </BuildMatrix>\n</CodeLite_Workspace>\n")
  ;
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2f8);
  std::__cxx11::string::~string((string *)&fout.field_0x240);
  std::__cxx11::string::~string((string *)(lprjdebug.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(workspaceSourcePath.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(workspaceFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(workspaceOutputDir.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmExtraCodeLiteGenerator::Generate()
{
  // Hold root tree information for creating the workspace
  std::string workspaceProjectName;
  std::string workspaceOutputDir;
  std::string workspaceFileName;
  std::string workspaceSourcePath;
  std::string lprjdebug;

  cmGeneratedFileStream fout;

  // loop projects and locate the root project.
  // and extract the information for creating the worspace
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
       it = this->GlobalGenerator->GetProjectMap().begin();
       it!= this->GlobalGenerator->GetProjectMap().end();
       ++it)
    {
    const cmMakefile* mf =it->second[0]->GetMakefile();
    this->ConfigName = GetConfigurationName( mf );

    if (strcmp(it->second[0]->GetCurrentBinaryDirectory(),
               it->second[0]->GetBinaryDirectory()) == 0)
      {
      workspaceOutputDir   = it->second[0]->GetCurrentBinaryDirectory();
      workspaceProjectName = it->second[0]->GetProjectName();
      workspaceSourcePath  = it->second[0]->GetSourceDirectory();
      workspaceFileName    = workspaceOutputDir+"/";
      workspaceFileName   += workspaceProjectName + ".workspace";
      this->WorkspacePath = it->second[0]->GetCurrentBinaryDirectory();;

      fout.Open(workspaceFileName.c_str(), false, false);
      fout << "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n"
           "<CodeLite_Workspace Name=\"" << workspaceProjectName << "\" >\n";
      }
    }

  // for each sub project in the workspace create a codelite project
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
       it = this->GlobalGenerator->GetProjectMap().begin();
       it!= this->GlobalGenerator->GetProjectMap().end();
       ++it)
    {
    // retrive project information
    std::string outputDir   = it->second[0]->GetCurrentBinaryDirectory();
    std::string projectName = it->second[0]->GetProjectName();
    std::string filename    = outputDir + "/" + projectName + ".project";

    // Make the project file relative to the workspace
    filename = cmSystemTools::RelativePath(this->WorkspacePath.c_str(),
                                          filename.c_str());

    // create a project file
    this->CreateProjectFile(it->second);
    fout << "  <Project Name=\"" << projectName << "\" Path=\""
    << filename << "\" Active=\"No\"/>\n";
    lprjdebug += "<Project Name=\"" + projectName
              + "\" ConfigName=\"" + this->ConfigName + "\"/>\n";
    }

  fout << "  <BuildMatrix>\n"
       "    <WorkspaceConfiguration Name=\""
       << this->ConfigName << "\" Selected=\"yes\">\n"
       "      " << lprjdebug << ""
       "    </WorkspaceConfiguration>\n"
       "  </BuildMatrix>\n"
       "</CodeLite_Workspace>\n";
}